

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void callTMres(lua_State *L,StkId res,TValue *f,TValue *p1,TValue *p2)

{
  long lVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined8 *puVar4;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  TValue *o1_3;
  TValue *o2_3;
  TValue *o1_2;
  TValue *o2_2;
  TValue *o1_1;
  TValue *o2_1;
  TValue *o1;
  TValue *o2;
  ptrdiff_t result;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  lua_State *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_RDI + 0x40);
  puVar2 = *(undefined8 **)(in_RDI + 0x10);
  *puVar2 = *in_RDX;
  *(undefined4 *)(puVar2 + 1) = *(undefined4 *)(in_RDX + 1);
  lVar3 = *(long *)(in_RDI + 0x10);
  *(undefined8 *)(lVar3 + 0x10) = *in_RCX;
  *(undefined4 *)(lVar3 + 0x18) = *(undefined4 *)(in_RCX + 1);
  lVar3 = *(long *)(in_RDI + 0x10);
  *(undefined8 *)(lVar3 + 0x20) = *in_R8;
  *(undefined4 *)(lVar3 + 0x28) = *(undefined4 *)(in_R8 + 1);
  if (*(long *)(in_RDI + 0x38) - *(long *)(in_RDI + 0x10) < 0x31) {
    luaD_growstack(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  }
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 0x30;
  luaD_call(in_stack_ffffffffffffff90,
            (StkId)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0);
  puVar4 = (undefined8 *)(*(long *)(in_RDI + 0x40) + (in_RSI - lVar1));
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + -0x10;
  puVar2 = *(undefined8 **)(in_RDI + 0x10);
  *puVar4 = *puVar2;
  *(undefined4 *)(puVar4 + 1) = *(undefined4 *)(puVar2 + 1);
  return;
}

Assistant:

static void callTMres(lua_State*L,StkId res,const TValue*f,
const TValue*p1,const TValue*p2){
ptrdiff_t result=savestack(L,res);
setobj(L,L->top,f);
setobj(L,L->top+1,p1);
setobj(L,L->top+2,p2);
luaD_checkstack(L,3);
L->top+=3;
luaD_call(L,L->top-3,1);
res=restorestack(L,result);
L->top--;
setobj(L,res,L->top);
}